

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O2

SymbolEntry * __thiscall
Scope::queryProperties(Scope *this,Address *addr,int4 size,Address *usepoint,uint4 *flags)

{
  SymbolEntry *pSVar1;
  uint uVar2;
  uint4 uVar3;
  Scope *pSVar4;
  SymbolEntry *res;
  SymbolEntry *local_38;
  
  local_38 = (SymbolEntry *)0x0;
  pSVar4 = Database::mapScope(this->glb->symboltab,this,addr,usepoint);
  pSVar4 = stackContainer(pSVar4,(Scope *)0x0,addr,size,usepoint,&local_38);
  pSVar1 = local_38;
  if (local_38 == (SymbolEntry *)0x0) {
    if (pSVar4 == (Scope *)0x0) {
      uVar2 = Database::getProperty(this->glb->symboltab,addr);
    }
    else {
      *flags = (uint)(pSVar4->fd == (Funcdata *)0x0) << 0xf | 0x410000;
      uVar3 = Database::getProperty(this->glb->symboltab,addr);
      uVar2 = uVar3 | *flags;
    }
  }
  else {
    uVar2 = local_38->symbol->flags | local_38->extraflags;
  }
  *flags = uVar2;
  return pSVar1;
}

Assistant:

SymbolEntry *Scope::queryProperties(const Address &addr,int4 size,
				    const Address &usepoint,uint4 &flags) const
{
  SymbolEntry *res = (SymbolEntry *)0;
  const Scope *basescope = glb->symboltab->mapScope(this,addr,usepoint);
  const Scope *finalscope = stackContainer(basescope,(const Scope *)0,addr,size,usepoint,&res);
  if (res != (SymbolEntry *)0) // If we found a symbol
    flags = res->getAllFlags(); // use its flags
  else if (finalscope != (Scope *)0) { // If we found just a scope
    // set flags just based on scope
    flags = Varnode::mapped | Varnode::addrtied;
    if (finalscope->isGlobal())
      flags |= Varnode::persist;
    flags |= glb->symboltab->getProperty(addr);
  }
  else
    flags = glb->symboltab->getProperty(addr);
  return res;
}